

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool duckdb::BitpackingAnalyze<long>(AnalyzeState *state,Vector *input,idx_t count)

{
  idx_t iVar1;
  idx_t iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat local_68;
  
  iVar1 = GetTypeIdSize((input->type).physical_type_);
  iVar2 = CompressionInfo::GetBlockSize(&state->info);
  if (iVar2 < iVar1 << 0xc) {
    bVar5 = false;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    uVar3 = 0;
    do {
      uVar4 = uVar3;
      if (count == uVar4) break;
      uVar3 = uVar4;
      if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)(local_68.sel)->sel_vector[uVar4];
      }
      if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0;
      }
      bVar5 = BitpackingState<long,_long>::Update<duckdb::EmptyBitpackingWriter>
                        ((BitpackingState<long,_long> *)(state + 1),
                         *(long *)(local_68.data + uVar3 * 8),bVar5);
      uVar3 = uVar4 + 1;
    } while (bVar5);
    bVar5 = count <= uVar4;
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_68);
  }
  return bVar5;
}

Assistant:

bool BitpackingAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &analyze_state = state.Cast<BitpackingAnalyzeState<T>>();

	// We use BITPACKING_METADATA_GROUP_SIZE tuples, which can exceed the block size.
	// In that case, we disable bitpacking.
	// we are conservative here by multiplying by 2
	auto type_size = GetTypeIdSize(input.GetType().InternalType());
	if (type_size * BITPACKING_METADATA_GROUP_SIZE * 2 > state.info.GetBlockSize()) {
		return false;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!analyze_state.state.template Update<EmptyBitpackingWriter>(data[idx], vdata.validity.RowIsValid(idx))) {
			return false;
		}
	}
	return true;
}